

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.hpp
# Opt level: O2

void __thiscall
tf::
ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
::_check_dependents(ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
                    *this,Pipeflow *pf)

{
  _Hash_node_value<unsigned_long,_false> *__k;
  iterator iVar1;
  mapped_type *pmVar2;
  _Node_iterator_base<unsigned_long,_false> __it;
  type tVar3;
  
  pf->_num_deferrals = pf->_num_deferrals + 1;
  __it._M_cur = (__node_type *)(pf->_dependents)._M_h._M_before_begin._M_nxt;
  while (__it._M_cur != (__node_type *)0x0) {
    __k = &(__it._M_cur)->super__Hash_node_value<unsigned_long,_false>;
    if ((ulong)((__it._M_cur)->super__Hash_node_value<unsigned_long,_false>).
               super__Hash_node_value_base<unsigned_long>._M_storage._M_storage < this->_num_tokens)
    {
      iVar1 = std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->_deferred_tokens)._M_h,(key_type *)__k);
      if (iVar1.
          super__Node_iterator_base<std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_false>.
          _M_cur == (__node_type *)0x0) {
        __it._M_cur = (__node_type *)
                      std::
                      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      ::erase(&(pf->_dependents)._M_h,__it._M_cur);
      }
      else {
        pmVar2 = std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->_token_dependencies,(key_type *)__k);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(pmVar2,&pf->_token);
        __it._M_cur = (__node_type *)((__it._M_cur)->super__Hash_node_base)._M_nxt;
      }
    }
    else {
      pmVar2 = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->_token_dependencies,(key_type *)__k);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(pmVar2,&pf->_token);
      tVar3 = ((__it._M_cur)->super__Hash_node_value<unsigned_long,_false>).
              super__Hash_node_value_base<unsigned_long>._M_storage._M_storage;
      if ((ulong)tVar3 < this->_longest_deferral) {
        tVar3 = (type)this->_longest_deferral;
      }
      this->_longest_deferral = (size_t)tVar3;
      __it._M_cur = (__node_type *)((__it._M_cur)->super__Hash_node_base)._M_nxt;
    }
  }
  return;
}

Assistant:

void ScalablePipeline<P>::_check_dependents(Pipeflow& pf) {
  ++pf._num_deferrals;
  
  for (auto it = pf._dependents.begin(); it != pf._dependents.end();) {
 
    // valid (e.g., 12.defer(16)) 
    if (*it >= _num_tokens) {
      _token_dependencies[*it].push_back(pf._token);
      _longest_deferral = std::max(_longest_deferral, *it);
      ++it;
    }
    // valid or invalid (e.g., 12.defer(7))
    else {
      auto pit = _deferred_tokens.find(*it);
      
      // valid (e.g., 7 is deferred)
      if (pit != _deferred_tokens.end()) {
        _token_dependencies[*it].push_back(pf._token);
        ++it;
      }

      else {
        it = pf._dependents.erase(it);
      }
    }
  }
}